

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::VerifyMark(LargeHeapBlock *this)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  LargeObjectHeader *this_01;
  char *pcVar5;
  void *target;
  char *objectAddressEnd;
  char *pcStack_30;
  uchar attributes;
  char *objectAddress;
  LargeObjectHeader *header;
  uint i;
  Recycler *recycler;
  LargeHeapBlock *this_local;
  
  if (((this->super_HeapBlock).needOOMRescan & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x3db,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = this->heapInfo->recycler;
  header._4_4_ = 0;
  do {
    if (this->allocCount <= header._4_4_) {
      return;
    }
    this_01 = GetHeaderByIndex(this,header._4_4_);
    if (this_01 != (LargeObjectHeader *)0x0) {
      pcStack_30 = (char *)LargeObjectHeader::GetAddress(this_01);
      bVar2 = HeapBlockMap64::IsMarked(&this_00->heapBlockMap,pcStack_30);
      if (bVar2) {
        bVar3 = LargeObjectHeader::GetAttributes(this_01,this->heapInfo->recycler->Cookie);
        if ((bVar3 & 4) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x3ee,"((attributes & NewFinalizeBit) == 0)",
                             "(attributes & NewFinalizeBit) == 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        if ((bVar3 & 0x20) == 0) {
          if ((this_01->field_0x1a & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                               ,0x3f5,"(!header->markOnOOMRescan)","!header->markOnOOMRescan");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          pcVar5 = pcStack_30 + this_01->objectSize;
          for (; pcStack_30 + 8 <= pcVar5; pcStack_30 = pcStack_30 + 8) {
            bVar2 = Recycler::VerifyMark(this_00,pcStack_30,*(void **)pcStack_30);
            if (((bVar2) && ((DAT_01eca37e & 1) != 0)) && ((DAT_01eca37f & 1) != 0)) {
              WBVerifyBitIsSet(this,pcStack_30);
            }
          }
        }
      }
    }
    header._4_4_ = header._4_4_ + 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::VerifyMark()
{
    Assert(!this->needOOMRescan);
    Recycler* recycler = this->heapInfo->recycler;

    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();
        if (!recycler->heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(this->heapInfo->recycler->Cookie);

        Assert((attributes & NewFinalizeBit) == 0);

        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

        Assert(!header->markOnOOMRescan);

        char * objectAddressEnd = objectAddress + header->objectSize;

        while (objectAddress + sizeof(void *) <= objectAddressEnd)
        {
            void* target = *(void **)objectAddress;

            if (recycler->VerifyMark(objectAddress, target))
            {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
                if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
                {
                    this->WBVerifyBitIsSet(objectAddress);
                }
#endif
            }

            objectAddress += sizeof(void *);
        }
    }
}